

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOSXBundleGenerator.cxx
# Opt level: O3

string * __thiscall
cmOSXBundleGenerator::InitMacOSXContentDirectory
          (string *__return_storage_ptr__,cmOSXBundleGenerator *this,char *pkgloc,string *config)

{
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  string loc;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  undefined1 *local_90;
  undefined8 local_88;
  size_t local_80;
  char *local_78;
  undefined8 local_70;
  undefined1 **local_68;
  undefined8 local_60;
  undefined1 *local_58;
  undefined1 local_50 [32];
  
  cmGeneratorTarget::GetMacContentDirectory(&local_d0,this->GT,config,RuntimeBinaryArtifact);
  local_b0._M_dataplus._M_p = (pointer)local_d0._M_string_length;
  local_b0._M_string_length = (size_type)local_d0._M_dataplus._M_p;
  local_90 = local_50;
  local_68 = (undefined1 **)0x0;
  local_60 = 1;
  local_50[0] = 0x2f;
  local_b0.field_2._8_8_ = 1;
  local_88 = 0;
  local_b0.field_2._M_allocated_capacity = (size_type)&local_d0;
  local_58 = local_90;
  local_80 = strlen(pkgloc);
  local_70 = 0;
  views._M_len = 3;
  views._M_array = (iterator)&local_b0;
  local_78 = pkgloc;
  cmCatViews(__return_storage_ptr__,views);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  cmsys::SystemTools::MakeDirectory(__return_storage_ptr__,(mode_t *)0x0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b0,pkgloc,(allocator<char> *)&local_68);
  std::__cxx11::string::find((char)&local_b0,0x2f);
  std::__cxx11::string::substr((ulong)&local_68,(ulong)&local_b0);
  std::__cxx11::string::operator=((string *)&local_b0,(string *)&local_68);
  if (local_68 != &local_58) {
    operator_delete(local_68,(ulong)(local_58 + 1));
  }
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string_const&>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)this->MacContentFolders,&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,(ulong)(local_b0.field_2._M_allocated_capacity + 1));
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmOSXBundleGenerator::InitMacOSXContentDirectory(
  const char* pkgloc, const std::string& config)
{
  // Construct the full path to the content subdirectory.

  std::string macdir = cmStrCat(this->GT->GetMacContentDirectory(
                                  config, cmStateEnums::RuntimeBinaryArtifact),
                                '/', pkgloc);
  cmSystemTools::MakeDirectory(macdir);

  // Record use of this content location.  Only the first level
  // directory is needed.
  {
    std::string loc = pkgloc;
    loc = loc.substr(0, loc.find('/'));
    this->MacContentFolders->insert(loc);
  }

  return macdir;
}